

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::FileDescriptorProto::InternalSerializeWithCachedSizesToArray
          (FileDescriptorProto *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  string *psVar2;
  char *data;
  Type *pTVar3;
  Type *value;
  Type *value_00;
  Type *value_01;
  Type *value_02;
  uint8 *puVar4;
  UnknownFieldSet *unknown_fields;
  int iVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int iVar6;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar2 = (this->name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.name");
    target = internal::WireFormatLite::WriteStringToArray(1,(this->name_).ptr_,target);
  }
  if ((uVar1 & 2) != 0) {
    psVar2 = (this->package_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.package");
    target = internal::WireFormatLite::WriteStringToArray(2,(this->package_).ptr_,target);
  }
  iVar5 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  iVar6 = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  this_00 = &this->dependency_;
  for (; iVar5 != iVar6; iVar6 = iVar6 + 1) {
    pTVar3 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar6);
    data = (pTVar3->_M_dataplus)._M_p;
    pTVar3 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar6);
    internal::WireFormatLite::VerifyUtf8String
              (data,(int)pTVar3->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.dependency");
    pTVar3 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar6);
    target = internal::WireFormatLite::WriteStringToArray(3,pTVar3,target);
  }
  iVar5 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar5 != iVar6; iVar6 = iVar6 + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                      (&(this->message_type_).super_RepeatedPtrFieldBase,iVar6);
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::DescriptorProto>
                       (4,value,deterministic,target);
  }
  iVar5 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar5 != iVar6; iVar6 = iVar6 + 1) {
    value_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar6);
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::EnumDescriptorProto>
                       (5,value_00,deterministic,target);
  }
  iVar5 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar5 != iVar6; iVar6 = iVar6 + 1) {
    value_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                         (&(this->service_).super_RepeatedPtrFieldBase,iVar6);
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::ServiceDescriptorProto>
                       (6,value_01,deterministic,target);
  }
  iVar5 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar5 != iVar6; iVar6 = iVar6 + 1) {
    value_02 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(this->extension_).super_RepeatedPtrFieldBase,iVar6);
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::FieldDescriptorProto>
                       (7,value_02,deterministic,target);
  }
  if ((uVar1 & 8) != 0) {
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::FileOptions>
                       (8,this->options_,deterministic,target);
  }
  if ((uVar1 & 0x10) != 0) {
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::SourceCodeInfo>
                       (9,this->source_code_info_,deterministic,target);
  }
  puVar4 = internal::WireFormatLite::WriteInt32ToArray(10,&this->public_dependency_,target);
  puVar4 = internal::WireFormatLite::WriteInt32ToArray(0xb,&this->weak_dependency_,puVar4);
  if ((uVar1 & 4) != 0) {
    psVar2 = (this->syntax_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.syntax");
    puVar4 = internal::WireFormatLite::WriteStringToArray(0xc,(this->syntax_).ptr_,puVar4);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    unknown_fields = FileDescriptorProto::unknown_fields(this);
    puVar4 = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,puVar4);
    return puVar4;
  }
  return puVar4;
}

Assistant:

::google::protobuf::uint8* FileDescriptorProto::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileDescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string package = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->package().data(), this->package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.package");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->package(), target);
  }

  // repeated string dependency = 3;
  for (int i = 0, n = this->dependency_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->dependency(i).data(), this->dependency(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.dependency");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(3, this->dependency(i), target);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (unsigned int i = 0, n = this->message_type_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        4, this->message_type(i), deterministic, target);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (unsigned int i = 0, n = this->enum_type_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        5, this->enum_type(i), deterministic, target);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (unsigned int i = 0, n = this->service_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, this->service(i), deterministic, target);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (unsigned int i = 0, n = this->extension_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        7, this->extension(i), deterministic, target);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        8, *this->options_, deterministic, target);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        9, *this->source_code_info_, deterministic, target);
  }

  // repeated int32 public_dependency = 10;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteInt32ToArray(10, this->public_dependency_, target);

  // repeated int32 weak_dependency = 11;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteInt32ToArray(11, this->weak_dependency_, target);

  // optional string syntax = 12;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->syntax().data(), this->syntax().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.syntax");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        12, this->syntax(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileDescriptorProto)
  return target;
}